

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall timer::timer(timer *this)

{
  EVP_PKEY_CTX *in_RDI;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  in_RDI[0x10] = (EVP_PKEY_CTX)((byte)in_RDI[0x10] & 0xfe);
  in_RDI[0x10] = (EVP_PKEY_CTX)((byte)in_RDI[0x10] & 0xfd);
  if ((g_inv_freq == 0.0) && (!NAN(g_inv_freq))) {
    init(in_RDI);
  }
  return;
}

Assistant:

timer::timer() :
   m_start_time(0),
   m_stop_time(0),
   m_started(false),
   m_stopped(false)
{
   if (!g_inv_freq)
      init();
}